

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_executor.cpp
# Opt level: O3

void __thiscall
duckdb::WindowExecutorBoundsState::WindowExecutorBoundsState
          (WindowExecutorBoundsState *this,WindowExecutorGlobalState *gstate)

{
  Allocator *allocator;
  pointer *__ptr;
  vector<duckdb::LogicalType,_true> bounds_types;
  allocator_type local_51;
  LogicalType local_50;
  vector<duckdb::LogicalType,_true> local_38;
  
  (this->super_WindowExecutorLocalState).range_cursor.
  super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
  super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)0x0;
  (this->super_WindowExecutorLocalState).super_WindowExecutorState._vptr_WindowExecutorState =
       (_func_int **)&PTR__WindowExecutorBoundsState_02446088;
  this->partition_mask = gstate->partition_mask;
  this->order_mask = gstate->order_mask;
  DataChunk::DataChunk(&this->bounds);
  WindowBoundariesState::WindowBoundariesState
            (&this->state,gstate->executor->wexpr,gstate->payload_count);
  LogicalType::LogicalType(&local_50,UBIGINT);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_38,8,
             &local_50,&local_51);
  LogicalType::~LogicalType(&local_50);
  allocator = Allocator::Get(gstate->executor->context);
  DataChunk::Initialize(&this->bounds,allocator,&local_38,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_38);
  return;
}

Assistant:

WindowExecutorBoundsState::WindowExecutorBoundsState(const WindowExecutorGlobalState &gstate)
    : WindowExecutorLocalState(gstate), partition_mask(gstate.partition_mask), order_mask(gstate.order_mask),
      state(gstate.executor.wexpr, gstate.payload_count) {
	vector<LogicalType> bounds_types(8, LogicalType(LogicalTypeId::UBIGINT));
	bounds.Initialize(Allocator::Get(gstate.executor.context), bounds_types);
}